

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

ostream * std::operator<<(ostream *ofs,LayerOffset *v)

{
  ostream *poVar1;
  char *pcVar2;
  double dVar3;
  double dVar4;
  string local_60;
  string local_40;
  
  dVar3 = ABS(v->_offset);
  dVar4 = ABS(v->_scale + -1.0);
  if ((2.220446049250313e-16 <= dVar3) || (2.220446049250313e-16 <= dVar4)) {
    std::operator<<(ofs,"(");
    if ((dVar3 < 2.220446049250313e-16) || (dVar4 < 2.220446049250313e-16)) {
      if (dVar3 < 2.220446049250313e-16) {
        pcVar2 = "scale = ";
        poVar1 = std::operator<<(ofs,"scale = ");
        dVar3 = v->_scale;
      }
      else {
        pcVar2 = "offset = ";
        poVar1 = std::operator<<(ofs,"offset = ");
        dVar3 = v->_offset;
      }
      tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
                (&local_60,(_anonymous_namespace_ *)pcVar2,dVar3);
      std::operator<<(poVar1,(string *)&local_60);
    }
    else {
      pcVar2 = "offset = ";
      poVar1 = std::operator<<(ofs,"offset = ");
      tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
                (&local_60,(_anonymous_namespace_ *)pcVar2,v->_offset);
      poVar1 = std::operator<<(poVar1,(string *)&local_60);
      pcVar2 = ", scale = ";
      poVar1 = std::operator<<(poVar1,", scale = ");
      tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
                (&local_40,(_anonymous_namespace_ *)pcVar2,v->_scale);
      std::operator<<(poVar1,(string *)&local_40);
      std::__cxx11::string::_M_dispose();
    }
    std::__cxx11::string::_M_dispose();
    std::operator<<(ofs,")");
  }
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const tinyusdz::LayerOffset &v) {
  bool print_offset{true};
  bool print_scale{true};

  if (std::fabs(v._offset) < std::numeric_limits<double>::epsilon()) {
    print_offset = false;
  }

  if (std::fabs(v._scale - 1.0) < std::numeric_limits<double>::epsilon()) {
    print_scale = false;
  }

  if (!print_offset && !print_scale) {
    // No need to print LayerOffset.
    return ofs;
  }

  // TODO: Do not print scale when it is 1.0
  ofs << "(";
  if (print_offset && print_scale) {
    ofs << "offset = " << tinyusdz::dtos(v._offset)
        << ", scale = " << tinyusdz::dtos(v._scale);
  } else if (print_offset) {
    ofs << "offset = " << tinyusdz::dtos(v._offset);
  } else {  // print_scale
    ofs << "scale = " << tinyusdz::dtos(v._scale);
  }
  ofs << ")";

  return ofs;
}